

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall RoboClaw::ReadCurrents(RoboClaw *this,int16_t *current1,int16_t *current2)

{
  uint32_t uVar1;
  bool *in_RDX;
  undefined2 *in_RSI;
  RoboClaw *in_RDI;
  uint32_t value;
  bool valid;
  undefined1 local_19;
  
  uVar1 = Read4(in_RDI,(uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),in_RDX);
  if ((local_19 & 1) != 0) {
    *in_RSI = (short)(uVar1 >> 0x10);
    *(short *)in_RDX = (short)uVar1;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool RoboClaw::ReadCurrents( int16_t &current1, int16_t &current2)
{
    bool valid;
    uint32_t value = Read4( m_address, GETCURRENTS,&valid);
    if(valid)
    {
        current1 = value>>16;
        current2 = value&0xFFFF;
    }
    return valid;
}